

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Nf_ManPreparePrint(int nVars,int *pComp,int *pPerm,char (*Line) [8])

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint local_50;
  uint uStack_4c;
  char t;
  int n;
  int c;
  int p;
  int i;
  char *pChar2;
  char *pChar;
  int nMints;
  int nPerms;
  char (*Line_local) [8];
  int *pPerm_local;
  int *pComp_local;
  int nVars_local;
  
  iVar2 = Extra_Factorial(nVars);
  iVar3 = 1 << ((byte)nVars & 0x1f);
  local_50 = 0;
  for (c = 0; c < nVars; c = c + 1) {
    (*Line)[c] = ((byte)nVars + 0x40) - (char)c;
  }
  (*Line)[nVars] = '+';
  (*Line)[nVars + 1] = '\0';
  for (c = 0; c < 2; c = c + 1) {
    cVar1 = '+';
    if (c != 0) {
      cVar1 = '-';
    }
    Line[(int)local_50][nVars] = cVar1;
    for (n = 0; n < iVar2; n = n + 1) {
      for (uStack_4c = 0; (int)uStack_4c < iVar3; uStack_4c = uStack_4c + 1) {
        strcpy(Line[(int)(local_50 + 1)],Line[(int)local_50]);
        local_50 = local_50 + 1;
        pcVar4 = Line[(int)local_50] + pComp[(int)uStack_4c];
        if ((*pcVar4 < 'A') || ('Z' < *pcVar4)) {
          if (('`' < *pcVar4) && (*pcVar4 < '{')) {
            *pcVar4 = *pcVar4 + -0x20;
          }
        }
        else {
          *pcVar4 = *pcVar4 + ' ';
        }
      }
      pcVar4 = Line[(int)local_50] + pPerm[n];
      cVar1 = *pcVar4;
      *pcVar4 = pcVar4[1];
      pcVar4[1] = cVar1;
    }
  }
  if (local_50 != iVar2 * 2 * iVar3) {
    __assert_fail("n == 2*nPerms*nMints",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x511,"void Nf_ManPreparePrint(int, int *, int *, char (*)[8])");
  }
  local_50 = 0;
  for (c = 0; c < 2; c = c + 1) {
    for (n = 0; n < iVar2; n = n + 1) {
      for (uStack_4c = 0; (int)uStack_4c < iVar3; uStack_4c = uStack_4c + 1) {
        printf("%8d : %d %3d %2d : %s\n",(ulong)local_50,(ulong)(uint)c,(ulong)(uint)n,
               (ulong)uStack_4c,Line + (int)local_50);
        local_50 = local_50 + 1;
      }
    }
  }
  return;
}

Assistant:

void Nf_ManPreparePrint( int nVars, int * pComp, int * pPerm, char Line[2*720*64][8] )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    char * pChar, * pChar2;
    int i, p, c, n = 0;
    for ( i = 0; i < nVars; i++ )
        Line[0][i] = 'A' + nVars - 1 - i;
    Line[0][nVars] = '+';
    Line[0][nVars+1] = 0;
    for ( i = 0; i < 2; i++ )
    {
        Line[n][nVars] = i ? '-' : '+';
        for ( p = 0; p < nPerms; p++ )
        {
            for ( c = 0; c < nMints; c++ )
            {
                strcpy( Line[n+1], Line[n] ); n++;
                pChar = &Line[n][pComp[c]];
                if ( *pChar >= 'A' && *pChar <= 'Z' )
                    *pChar += 'a' - 'A';
                else if ( *pChar >= 'a' && *pChar <= 'z' )
                    *pChar -= 'a' - 'A';
            }
            pChar  = &Line[n][pPerm[p]];
            pChar2 = pChar + 1;
            ABC_SWAP( char, *pChar, *pChar2 );
        }
    }
    assert( n == 2*nPerms*nMints );
    n = 0;
    for ( i = 0; i < 2; i++ )
        for ( p = 0; p < nPerms; p++ )
            for ( c = 0; c < nMints; c++ )
                printf("%8d : %d %3d %2d : %s\n", n, i, p, c, Line[n]), n++;
}